

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_fill(Integer g_a,void *val)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Integer IVar4;
  long lVar5;
  undefined8 *puVar6;
  undefined8 *in_RSI;
  Integer in_RDI;
  Integer I_elems;
  Integer grp_me;
  char err_string_1 [256];
  char err_string [256];
  Integer num_blocks;
  Integer grp_id;
  C_Long elems;
  int local_sync_end;
  int local_sync_begin;
  char *ptr;
  int handle;
  int i;
  ulong in_stack_fffffffffffffda0;
  char local_248 [16];
  Integer *in_stack_fffffffffffffdc8;
  void *in_stack_fffffffffffffdd0;
  Integer in_stack_fffffffffffffdd8;
  Integer in_stack_fffffffffffffde0;
  char local_148 [128];
  Integer in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  char *local_20;
  int local_14;
  
  iVar2 = _ga_sync_end;
  iVar1 = _ga_sync_begin;
  iVar3 = (int)in_RDI + 1000;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  IVar4 = pnga_get_pgroup(in_RDI);
  if (iVar1 != 0) {
    pnga_pgroup_sync(in_stack_fffffffffffffda0);
  }
  if ((in_RDI + 1000 < 0) || ((long)_max_global_array <= in_RDI + 1000)) {
    sprintf(local_148,"%s: INVALID ARRAY HANDLE","ga_fill");
    pnga_error(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  if (GA[in_RDI + 1000].actv == 0) {
    sprintf(local_248,"%s: ARRAY NOT ACTIVE","ga_fill");
    pnga_error(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  if (((GA[iVar3].type < 1000) || (0x4e7 < GA[iVar3].type)) ||
     (ga_types[GA[iVar3].type + -1000].active == 0)) {
    pnga_error(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  lVar5 = GA[iVar3].size / (long)GA[iVar3].elemsize;
  if (GA[iVar3].block_total < 0) {
    if (IVar4 < 0) {
      local_20 = GA[iVar3].ptr[GAme];
    }
    else {
      local_20 = GA[iVar3].ptr[PGRP_LIST[GA[iVar3].p_handle].map_proc_list[GAme]];
    }
    in_stack_fffffffffffffda0 = (ulong)(GA[iVar3].type - 0x3e9);
    switch(in_stack_fffffffffffffda0) {
    case 0:
      for (local_14 = 0; local_14 < lVar5; local_14 = local_14 + 1) {
        *(undefined4 *)(local_20 + (long)local_14 * 4) = *(undefined4 *)in_RSI;
      }
      break;
    case 1:
      for (local_14 = 0; local_14 < lVar5; local_14 = local_14 + 1) {
        *(undefined8 *)(local_20 + (long)local_14 * 8) = *in_RSI;
      }
      break;
    case 2:
      for (local_14 = 0; local_14 < lVar5; local_14 = local_14 + 1) {
        *(undefined4 *)(local_20 + (long)local_14 * 4) = *(undefined4 *)in_RSI;
      }
      break;
    case 3:
      for (local_14 = 0; local_14 < lVar5; local_14 = local_14 + 1) {
        *(undefined8 *)(local_20 + (long)local_14 * 8) = *in_RSI;
      }
      break;
    default:
      pnga_error(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      break;
    case 5:
      for (local_14 = 0; local_14 < lVar5; local_14 = local_14 + 1) {
        *(undefined8 *)(local_20 + (long)local_14 * 8) = *in_RSI;
      }
      break;
    case 6:
      for (local_14 = 0; local_14 < lVar5; local_14 = local_14 + 1) {
        *(undefined8 *)(local_20 + (long)local_14 * 0x10) = *in_RSI;
        *(undefined8 *)(local_20 + (long)local_14 * 0x10 + 8) = in_RSI[1];
      }
      break;
    case 0xf:
      for (local_14 = 0; local_14 < lVar5; local_14 = local_14 + 1) {
        *(undefined8 *)(local_20 + (long)local_14 * 8) = *in_RSI;
      }
    }
  }
  else {
    pnga_access_block_segment_ptr
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
               in_stack_fffffffffffffdc8);
    switch(GA[iVar3].type) {
    case 0x3e9:
      for (local_14 = 0; local_14 < lVar5; local_14 = local_14 + 1) {
        *(undefined4 *)((long)local_20 + (long)local_14 * 4) = *(undefined4 *)in_RSI;
      }
      break;
    case 0x3ea:
      for (local_14 = 0; local_14 < lVar5; local_14 = local_14 + 1) {
        *(undefined8 *)((long)local_20 + (long)local_14 * 8) = *in_RSI;
      }
      break;
    case 0x3eb:
      for (local_14 = 0; local_14 < lVar5; local_14 = local_14 + 1) {
        *(undefined4 *)((long)local_20 + (long)local_14 * 4) = *(undefined4 *)in_RSI;
      }
      break;
    case 0x3ec:
      for (local_14 = 0; local_14 < lVar5; local_14 = local_14 + 1) {
        *(undefined8 *)((long)local_20 + (long)local_14 * 8) = *in_RSI;
      }
      break;
    default:
      pnga_error(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      break;
    case 0x3ee:
      for (local_14 = 0; local_14 < lVar5; local_14 = local_14 + 1) {
        *(undefined8 *)((long)local_20 + (long)local_14 * 8) = *in_RSI;
      }
      break;
    case 0x3ef:
      for (local_14 = 0; local_14 < lVar5; local_14 = local_14 + 1) {
        puVar6 = (undefined8 *)((long)local_20 + (long)local_14 * 0x10);
        *puVar6 = *in_RSI;
        puVar6[1] = in_RSI[1];
      }
      break;
    case 0x3f8:
      for (local_14 = 0; local_14 < lVar5; local_14 = local_14 + 1) {
        *(undefined8 *)((long)local_20 + (long)local_14 * 8) = *in_RSI;
      }
    }
    pnga_release_block_segment(in_RDI,GAme);
  }
  if (iVar2 != 0) {
    pnga_pgroup_sync(in_stack_fffffffffffffda0);
  }
  return;
}

Assistant:

void pnga_fill(Integer g_a, void* val)
{
  int i,handle=GA_OFFSET + (int)g_a;
  char *ptr;
  int local_sync_begin,local_sync_end;
  C_Long elems;
  Integer grp_id;
  Integer num_blocks;


  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous sync masking*/
  grp_id = pnga_get_pgroup(g_a);
  if(local_sync_begin)pnga_pgroup_sync(grp_id);


  ga_check_handleM(g_a, "ga_fill");
  gam_checktype(GA[handle].type);
  elems = GA[handle].size/((C_Long)GA[handle].elemsize);
  num_blocks = GA[handle].block_total;

  if (num_blocks < 0) {
    /* Bruce..Please CHECK if this is correct */
    if (grp_id >= 0){  
      Integer grp_me = PGRP_LIST[GA[handle].p_handle].map_proc_list[GAme];
      ptr = GA[handle].ptr[grp_me];
    }
    else  ptr = GA[handle].ptr[GAme];

    switch (GA[handle].type){
      case C_DCPL: 
        for(i=0; i<elems;i++)((DoubleComplex*)ptr)[i]=*(DoubleComplex*)val;
        break;
      case C_SCPL: 
        for(i=0; i<elems;i++)((SingleComplex*)ptr)[i]=*(SingleComplex*)val;
        break;
      case C_DBL:  
        for(i=0; i<elems;i++)((double*)ptr)[i]=*(double*)val;
        break;
      case C_INT:  
        for(i=0; i<elems;i++)((int*)ptr)[i]=*(int*)val;
        break;
      case C_FLOAT:
        for(i=0; i<elems;i++)((float*)ptr)[i]=*(float*)val;
        break;     
      case C_LONG:
        for(i=0; i<elems;i++)((long*)ptr)[i]=*(long*)val;
        break;
      case C_LONGLONG:
        for(i=0; i<elems;i++)((long long*)ptr)[i]=*( long long*)val;
        break;
      default:
        pnga_error("type not supported",GA[handle].type);
    }
  } else {
    Integer I_elems = (Integer)elems;
    pnga_access_block_segment_ptr(g_a,GAme,&ptr,&I_elems);
    elems = (C_Long)I_elems;
    switch (GA[handle].type){
      case C_DCPL: 
        for(i=0; i<elems;i++)((DoubleComplex*)ptr)[i]=*(DoubleComplex*)val;
        break;
      case C_SCPL: 
        for(i=0; i<elems;i++)((SingleComplex*)ptr)[i]=*(SingleComplex*)val;
        break;
      case C_DBL:  
        for(i=0; i<elems;i++)((double*)ptr)[i]=*(double*)val;
        break;
      case C_INT:  
        for(i=0; i<elems;i++)((int*)ptr)[i]=*(int*)val;
        break;
      case C_FLOAT:
        for(i=0; i<elems;i++)((float*)ptr)[i]=*(float*)val;
        break;     
      case C_LONG:
        for(i=0; i<elems;i++)((long*)ptr)[i]=*(long*)val;
        break;
      case C_LONGLONG:
        for(i=0; i<elems;i++)((long long*)ptr)[i]=*(long long*)val;
        break;
      default:
        pnga_error("type not supported",GA[handle].type);
    }
    pnga_release_block_segment(g_a,GAme);
  }

  if(local_sync_end)pnga_pgroup_sync(grp_id);

}